

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

void __thiscall booster::locale::impl_icu::num_parse<char>::~num_parse(num_parse<char> *this)

{
  num_parse<char> *in_RDI;
  
  ~num_parse(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

num_parse(cdata const &d,size_t refs = 0) : 
        std::num_get<CharType>(refs),
        loc_(d.locale),
        enc_(d.encoding)
    {
    }